

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O3

ReadFileResult
cmCMakePresetsGraphInternal::TestPresetsHelper
          (vector<cmCMakePresetsGraph::TestPreset,_std::allocator<cmCMakePresetsGraph::TestPreset>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::TestPreset> *in_R8;
  Value *local_40;
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>
  local_38;
  undefined5 uStack_20;
  undefined3 local_1b;
  undefined5 uStack_18;
  
  if (TestPresetsHelper(std::vector<cmCMakePresetsGraph::TestPreset,std::allocator<cmCMakePresetsGraph::TestPreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&TestPresetsHelper(std::vector<cmCMakePresetsGraph::TestPreset,std::allocator<cmCMakePresetsGraph::TestPreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>
      ::vector(&local_38,
               (vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>
                *)(anonymous_namespace)::TestPresetHelper);
      uStack_18 = (anonymous_namespace)::TestPresetHelper._32_5_;
      uStack_20 = (anonymous_namespace)::TestPresetHelper._24_5_;
      local_1b = (anonymous_namespace)::TestPresetHelper._29_3_;
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::TestPreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>>
                (&TestPresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&local_38,in_R8);
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>
      ::~vector(&local_38);
      __cxa_atexit(std::_Function_base::~_Function_base,&TestPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&TestPresetsHelper(std::vector<cmCMakePresetsGraph::TestPreset,std::allocator<cmCMakePresetsGraph::TestPreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  local_40 = value;
  if (TestPresetsHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*TestPresetsHelper::helper._M_invoker)
                      ((_Any_data *)&TestPresetsHelper::helper,out,&local_40);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult TestPresetsHelper(
  std::vector<cmCMakePresetsGraph::TestPreset>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<TestPreset>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
    TestPresetHelper);

  return helper(out, value);
}